

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::performConvexcast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  double dVar2;
  btScalar *pbVar3;
  btScalar in_EDX;
  btScalar in_ESI;
  long in_RDI;
  double *graphicsbase_1;
  float *graphicsbase;
  int graphicsindex;
  int j;
  btVector3 *meshScaling;
  uint *gfxbase;
  PHY_ScalarType indicestype;
  int numfaces;
  int indexstride;
  uchar *indexbase;
  int stride;
  PHY_ScalarType type;
  int numverts;
  uchar *vertexbase;
  btVector3 m_triangle [3];
  uint local_114;
  btVector3 *local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  btVector3 local_e0;
  double *local_d0;
  float local_c4;
  float local_c0;
  float local_bc;
  btVector3 local_b8;
  float *local_a8;
  uint local_a0;
  int local_9c;
  btVector3 *local_98;
  long local_90;
  int local_84;
  undefined1 local_80 [4];
  int local_7c;
  long local_78;
  int local_6c;
  int local_68;
  undefined1 local_64 [4];
  long local_60;
  btVector3 local_58 [3];
  btVector3 bStack_28;
  
  local_f8 = local_58;
  bStack_28.m_floats[2] = in_EDX;
  bStack_28.m_floats[3] = in_ESI;
  do {
    btVector3::btVector3(local_f8);
    local_f8 = local_f8 + 1;
  } while (local_f8 != &bStack_28);
  (**(code **)(**(long **)(in_RDI + 8) + 0x20))
            (*(long **)(in_RDI + 8),&local_60,local_64,&local_68,&local_6c,&local_78,&local_7c,
             local_80,&local_84,bStack_28.m_floats[3]);
  local_90 = local_78 + (int)bStack_28.m_floats[2] * local_7c;
  local_98 = btStridingMeshInterface::getScaling(*(btStridingMeshInterface **)(in_RDI + 8));
  for (local_9c = 2; -1 < local_9c; local_9c = local_9c + -1) {
    if (local_84 == 3) {
      local_114 = (uint)*(ushort *)(local_90 + (long)local_9c * 2);
    }
    else {
      local_114 = *(uint *)(local_90 + (long)local_9c * 4);
    }
    local_a0 = local_114;
    if (local_68 == 0) {
      local_a8 = (float *)(local_60 + (int)(local_114 * local_6c));
      fVar1 = *local_a8;
      pbVar3 = btVector3::getX(local_98);
      local_bc = fVar1 * *pbVar3;
      fVar1 = local_a8[1];
      pbVar3 = btVector3::getY(local_98);
      local_c0 = fVar1 * *pbVar3;
      fVar1 = local_a8[2];
      pbVar3 = btVector3::getZ(local_98);
      local_c4 = fVar1 * *pbVar3;
      btVector3::btVector3(&local_b8,&local_bc,&local_c0,&local_c4);
      *(undefined8 *)local_58[local_9c].m_floats = local_b8.m_floats._0_8_;
      *(undefined8 *)(local_58[local_9c].m_floats + 2) = local_b8.m_floats._8_8_;
    }
    else {
      local_d0 = (double *)(local_60 + (int)(local_114 * local_6c));
      dVar2 = *local_d0;
      pbVar3 = btVector3::getX(local_98);
      local_e4 = (float)dVar2 * *pbVar3;
      dVar2 = local_d0[1];
      pbVar3 = btVector3::getY(local_98);
      local_e8 = (float)dVar2 * *pbVar3;
      dVar2 = local_d0[2];
      pbVar3 = btVector3::getZ(local_98);
      local_ec = (float)dVar2 * *pbVar3;
      btVector3::btVector3(&local_e0,&local_e4,&local_e8,&local_ec);
      *(undefined8 *)local_58[local_9c].m_floats = local_e0.m_floats._0_8_;
      *(undefined8 *)(local_58[local_9c].m_floats + 2) = local_e0.m_floats._8_8_;
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
            (*(long **)(in_RDI + 0x10),local_58,bStack_28.m_floats[3],bStack_28.m_floats[2]);
  (**(code **)(**(long **)(in_RDI + 8) + 0x30))(*(long **)(in_RDI + 8),bStack_28.m_floats[3]);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			btVector3 m_triangle[3];
			const unsigned char *vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char *indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase+nodeTriangleIndex*indexstride);
			btAssert(indicestype==PHY_INTEGER||indicestype==PHY_SHORT);
	
			const btVector3& meshScaling = m_meshInterface->getScaling();
			for (int j=2;j>=0;j--)
			{
				int graphicsindex = indicestype==PHY_SHORT?((unsigned short*)gfxbase)[j]:gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase+graphicsindex*stride);

					m_triangle[j] = btVector3(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());		
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase+graphicsindex*stride);
					
					m_triangle[j] = btVector3(btScalar(graphicsbase[0])*meshScaling.getX(),btScalar(graphicsbase[1])*meshScaling.getY(),btScalar(graphicsbase[2])*meshScaling.getZ());		
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle,nodeSubPart,nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}